

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void clipme(Terminal *term,pos top,pos bottom,_Bool rect,_Bool desel,int *clipboards,
           wchar_t n_clipboards)

{
  termchar *ptVar1;
  truecolour tc;
  unsigned_long uVar2;
  undefined4 uVar3;
  int *piVar4;
  termline *ptVar5;
  char byte;
  _Bool _Var6;
  bool bVar7;
  wchar_t wVar8;
  termline *line;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  wchar_t *pwVar12;
  long lVar13;
  int iVar14;
  wchar_t y;
  undefined7 in_register_00000081;
  wchar_t wVar15;
  ulong uVar16;
  wchar_t wVar17;
  bool bVar18;
  char buf_1 [4];
  clip_workbuf buf;
  wchar_t wbuf [4];
  wchar_t cbuf [16];
  wchar_t local_11c;
  char local_104;
  undefined1 local_103;
  ulong local_100;
  ulong local_f8;
  undefined4 local_ec;
  uint local_e8;
  wchar_t local_e4;
  termline *local_e0;
  clip_workbuf local_d8;
  int *local_98;
  pos local_90;
  wchar_t local_88 [4];
  wchar_t local_78 [18];
  
  local_ec = (undefined4)CONCAT71(in_register_00000081,desel);
  local_d8.bufsize = 0x1400;
  local_d8.bufpos = 0;
  local_100 = 0;
  local_98 = clipboards;
  local_d8.textbuf = (wchar_t *)safemalloc(0x1400,4,0);
  local_d8.textptr = local_d8.textbuf;
  local_d8.attrbuf = (wchar_t *)safemalloc(local_d8.bufsize,4,0);
  local_d8.attrptr = local_d8.attrbuf;
  local_d8.tcbuf = (truecolour *)safemalloc(local_d8.bufsize,8,0);
  wVar17 = bottom.x;
  bVar18 = top.x < wVar17;
  if (top.y != bottom.y) {
    bVar18 = top.y < bottom.y;
  }
  local_d8.tcptr = local_d8.tcbuf;
  if (bVar18) {
    if (rect) {
      local_100 = (ulong)top >> 0x20;
    }
    local_100 = local_100 & 0xffffffff;
    uVar16 = (ulong)top >> 0x20;
    local_90 = bottom;
    do {
      y = top.y;
      line = lineptr(term,y,L'ᤲ',L'\0');
      wVar8 = term->cols;
      uVar9 = (ulong)(uint)wVar8;
      wVar15 = bottom.y;
      local_11c = y;
      if ((line->lattr & 0x10) == 0) {
        if (wVar8 != L'\0') {
          uVar9 = (ulong)wVar8;
          pwVar12 = &line->chars[uVar9 - 1].cc_next;
          do {
            if (((((termchar *)(pwVar12 + -6))->chr != 0x20 &&
                  ((uint)((termchar *)(pwVar12 + -6))->chr & 0xfffffcff) != 0xd820) ||
                (*pwVar12 != L'\0')) || ((long)uVar9 <= (long)(wchar_t)uVar16)) goto LAB_0010aa06;
            pwVar12 = pwVar12 + -8;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          uVar9 = 0;
        }
LAB_0010aa06:
        local_e4 = (wchar_t)uVar9;
        bVar18 = y < wVar15;
        if (y == wVar15) {
          bVar18 = local_e4 < wVar17;
        }
        local_e8 = (uint)bVar18;
      }
      else {
        local_e4 = wVar8 + L'\xfffffffd';
        local_e8 = 0;
        if (wVar8 < L'\x03') {
          local_e4 = L'\0';
        }
        if (line->trusted == false) {
          local_e4 = wVar8;
        }
        if ((line->lattr & 0x20) != 0) {
          bVar18 = local_e4 == L'\0';
          local_e4 = local_e4 + L'\xffffffff';
          if (bVar18) {
            local_e4 = wVar8;
          }
          local_11c = y - (uint)bVar18;
        }
      }
      wVar8 = wVar17;
      if (local_e4 < wVar17) {
        wVar8 = local_e4;
      }
      bVar18 = (wchar_t)uVar16 < wVar17;
      if (y != wVar15) {
        bVar18 = y < wVar15;
      }
      if (rect) {
        local_e8 = (uint)(y < wVar15);
        local_e4 = wVar8;
      }
      ptVar5 = line;
      if (bVar18) {
        do {
          local_e0 = ptVar5;
          bVar18 = y < local_11c;
          if (y == local_11c) {
            bVar18 = (wchar_t)uVar16 < local_e4;
          }
          if (!bVar18) break;
          local_f8 = uVar16;
          if (line->chars[(wchar_t)uVar16].chr != 0xdfff) {
            uVar16 = uVar16 & 0xffffffff;
            do {
              ptVar1 = line->chars;
              iVar14 = (int)uVar16;
              uVar16 = ptVar1[iVar14].chr;
              uVar10 = (uint)uVar16 & 0xffffff00;
              if (uVar10 == 0xd800) {
LAB_0010aae7:
                lVar13 = 0x40c;
LAB_0010aaf3:
                uVar16 = (ulong)*(uint *)((long)term->ucsdata->unitab_scoacs +
                                         (uVar16 & 0xff) * 4 + lVar13 + -0xc);
              }
              else {
                if (uVar10 == 0xda00) {
                  lVar13 = 0xc;
                  goto LAB_0010aaf3;
                }
                if (uVar10 == 0xd900) {
                  lVar13 = 0xc0c;
                  if (term->rawcnp == true) goto LAB_0010aae7;
                  goto LAB_0010aaf3;
                }
              }
              local_78[0] = (wchar_t)uVar16;
              if ((local_78[0] & 0xffffff00U) == 0xdd00) {
                lVar13 = 0x80c;
LAB_0010ab29:
                local_78[0] = *(wchar_t *)
                               ((long)term->ucsdata->unitab_scoacs +
                               (uVar16 & 0xff) * 4 + lVar13 + -0xc);
              }
              else if ((local_78[0] & 0xffffff00U) == 0xdc00) {
                lVar13 = 0x100c;
                goto LAB_0010ab29;
              }
              uVar2 = ptVar1[iVar14].attr;
              tc = ptVar1[iVar14].truecolour;
              local_78[1] = 0;
              if (((local_78[0] & 0xfffffe00U) == 0xdc00) &&
                 (byte = (char)local_78[0],
                 (local_78[0] & 0xffU) != 0x7f && 0x1f < (uint)(local_78[0] & 0xffU))) {
                _Var6 = is_dbcs_leadbyte(term->ucsdata->font_codepage,byte);
                wVar8 = L'\x01';
                if (_Var6) {
                  iVar11 = (int)local_f8;
                  local_f8 = (ulong)(iVar11 + 1);
                  local_103 = (undefined1)local_e0->chars[(long)iVar11 + 1].chr;
                  wVar8 = L'\x02';
                }
                local_104 = byte;
                wVar8 = mb_to_wc(term->ucsdata->font_codepage,L'\0',&local_104,wVar8,local_88,
                                 L'\x04');
                if (L'\0' < wVar8) {
                  memcpy(local_78,local_88,(ulong)(uint)wVar8 * 4);
                  local_78[(uint)wVar8] = L'\0';
                }
              }
              if (local_78[0] != L'\0') {
                pwVar12 = local_78;
                wVar8 = local_78[0];
                do {
                  pwVar12 = pwVar12 + 1;
                  clip_addchar(&local_d8,wVar8,(wchar_t)uVar2,tc);
                  wVar8 = *pwVar12;
                } while (wVar8 != L'\0');
              }
              wVar8 = local_e0->chars[iVar14].cc_next;
              uVar16 = (ulong)(uint)(iVar14 + wVar8);
              line = local_e0;
            } while (wVar8 != L'\0');
          }
          wVar8 = (int)local_f8 + L'\x01';
          uVar16 = (ulong)(uint)wVar8;
          bVar18 = wVar8 < wVar17;
          if (y != local_90.y) {
            bVar18 = y < local_90.y;
          }
          bottom = local_90;
          ptVar5 = local_e0;
        } while (bVar18);
      }
      if ((char)local_e8 != '\0') {
        clip_addchar(&local_d8,L'\n',L'\0',(term->basic_erase_char).truecolour);
      }
      if (line->temporary == true) {
        freetermline(line);
      }
      top.y = y + L'\x01';
      top.x = L'\0';
      bVar18 = top.y < bottom.y;
      if (top.y == bottom.y) {
        bVar18 = (wchar_t)local_100 < wVar17;
      }
      uVar16 = local_100;
    } while (bVar18);
  }
  piVar4 = local_98;
  uVar3 = local_ec;
  if (L'\0' < n_clipboards) {
    uVar16 = 0;
    bVar18 = false;
    do {
      wVar17 = piVar4[uVar16];
      bVar7 = bVar18;
      if ((wVar17 != L'\0') && (bVar7 = true, wVar17 != L'\x01')) {
        (*term->win->vt->clip_write)
                  (term->win,wVar17,local_d8.textbuf,local_d8.attrbuf,local_d8.tcbuf,
                   (wchar_t)local_d8.bufpos,SUB41(uVar3,0));
        bVar7 = bVar18;
      }
      uVar16 = uVar16 + 1;
      bVar18 = bVar7;
    } while ((uint)n_clipboards != uVar16);
    if (bVar7) {
      safefree(term->last_selected_text);
      safefree(term->last_selected_attr);
      safefree(term->last_selected_tc);
      term->last_selected_text = local_d8.textbuf;
      term->last_selected_attr = local_d8.attrbuf;
      term->last_selected_tc = local_d8.tcbuf;
      term->last_selected_len = local_d8.bufpos;
      return;
    }
  }
  safefree(local_d8.textbuf);
  safefree(local_d8.attrbuf);
  safefree(local_d8.tcbuf);
  return;
}

Assistant:

static void clipme(Terminal *term, pos top, pos bottom, bool rect, bool desel,
                   const int *clipboards, int n_clipboards)
{
    clip_workbuf buf;
    int old_top_x;
    int attr;
    truecolour tc;

    buf.bufsize = 5120;
    buf.bufpos = 0;
    buf.textptr = buf.textbuf = snewn(buf.bufsize, wchar_t);
    buf.attrptr = buf.attrbuf = snewn(buf.bufsize, int);
    buf.tcptr = buf.tcbuf = snewn(buf.bufsize, truecolour);

    old_top_x = top.x;                 /* needed for rect==1 */

    while (poslt(top, bottom)) {
        bool nl = false;
        termline *ldata = lineptr(top.y);
        pos nlpos;

        /*
         * nlpos will point at the maximum position on this line we
         * should copy up to. So we start it at the end of the
         * line...
         */
        nlpos.y = top.y;
        nlpos.x = term->cols;

        /*
         * ... move it backwards if there's unused space at the end
         * of the line (and also set `nl' if this is the case,
         * because in normal selection mode this means we need a
         * newline at the end)...
         */
        if (!(ldata->lattr & LATTR_WRAPPED)) {
            while (nlpos.x &&
                   IS_SPACE_CHR(ldata->chars[nlpos.x - 1].chr) &&
                   !ldata->chars[nlpos.x - 1].cc_next &&
                   poslt(top, nlpos))
                decpos(nlpos);
            if (poslt(nlpos, bottom))
                nl = true;
        } else {
            if (ldata->trusted) {
                /* A wrapped line with a trust sigil on it terminates
                 * a few characters earlier. */
                nlpos.x = (nlpos.x < TRUST_SIGIL_WIDTH ? 0 :
                           nlpos.x - TRUST_SIGIL_WIDTH);
            }
            if (ldata->lattr & LATTR_WRAPPED2) {
                /* Ignore the last char on the line in a WRAPPED2 line. */
                decpos(nlpos);
            }
        }

        /*
         * ... and then clip it to the terminal x coordinate if
         * we're doing rectangular selection. (In this case we
         * still did the above, so that copying e.g. the right-hand
         * column from a table doesn't fill with spaces on the
         * right.)
         */
        if (rect) {
            if (nlpos.x > bottom.x)
                nlpos.x = bottom.x;
            nl = (top.y < bottom.y);
        }

        while (poslt(top, bottom) && poslt(top, nlpos)) {
#if 0
            char cbuf[16], *p;
            sprintf(cbuf, "<U+%04x>", (ldata[top.x] & 0xFFFF));
#else
            wchar_t cbuf[16], *p;
            int c;
            int x = top.x;

            if (ldata->chars[x].chr == UCSWIDE) {
                top.x++;
                continue;
            }

            while (1) {
                int uc = ldata->chars[x].chr;
                attr = ldata->chars[x].attr;
                tc = ldata->chars[x].truecolour;

                switch (uc & CSET_MASK) {
                  case CSET_LINEDRW:
                    if (!term->rawcnp) {
                        uc = term->ucsdata->unitab_xterm[uc & 0xFF];
                        break;
                    }
                  case CSET_ASCII:
                    uc = term->ucsdata->unitab_line[uc & 0xFF];
                    break;
                  case CSET_SCOACS:
                    uc = term->ucsdata->unitab_scoacs[uc&0xFF];
                    break;
                }
                switch (uc & CSET_MASK) {
                  case CSET_ACP:
                    uc = term->ucsdata->unitab_font[uc & 0xFF];
                    break;
                  case CSET_OEMCP:
                    uc = term->ucsdata->unitab_oemcp[uc & 0xFF];
                    break;
                }

                c = (uc & ~CSET_MASK);
#ifdef PLATFORM_IS_UTF16
                if (uc > 0x10000 && uc < 0x110000) {
                    cbuf[0] = 0xD800 | ((uc - 0x10000) >> 10);
                    cbuf[1] = 0xDC00 | ((uc - 0x10000) & 0x3FF);
                    cbuf[2] = 0;
                } else
#endif
                {
                    cbuf[0] = uc;
                    cbuf[1] = 0;
                }

                if (DIRECT_FONT(uc)) {
                    if (c >= ' ' && c != 0x7F) {
                        char buf[4];
                        WCHAR wbuf[4];
                        int rv;
                        if (is_dbcs_leadbyte(term->ucsdata->font_codepage, (BYTE) c)) {
                            buf[0] = c;
                            buf[1] = (char) (0xFF & ldata->chars[top.x + 1].chr);
                            rv = mb_to_wc(term->ucsdata->font_codepage, 0, buf, 2, wbuf, 4);
                            top.x++;
                        } else {
                            buf[0] = c;
                            rv = mb_to_wc(term->ucsdata->font_codepage, 0, buf, 1, wbuf, 4);
                        }

                        if (rv > 0) {
                            memcpy(cbuf, wbuf, rv * sizeof(wchar_t));
                            cbuf[rv] = 0;
                        }
                    }
                }
#endif

                for (p = cbuf; *p; p++)
                    clip_addchar(&buf, *p, attr, tc);

                if (ldata->chars[x].cc_next)
                    x += ldata->chars[x].cc_next;
                else
                    break;
            }
            top.x++;
        }
        if (nl) {
            int i;
            for (i = 0; i < sel_nl_sz; i++)
                clip_addchar(&buf, sel_nl[i], 0, term->basic_erase_char.truecolour);
        }
        top.y++;
        top.x = rect ? old_top_x : 0;

        unlineptr(ldata);
    }
#if SELECTION_NUL_TERMINATED
    clip_addchar(&buf, 0, 0, term->basic_erase_char.truecolour);
#endif
    /* Finally, transfer all that to the clipboard(s). */
    {
        int i;
        bool clip_local = false;
        for (i = 0; i < n_clipboards; i++) {
            if (clipboards[i] == CLIP_LOCAL) {
                clip_local = true;
            } else if (clipboards[i] != CLIP_NULL) {
                win_clip_write(
                    term->win, clipboards[i], buf.textbuf, buf.attrbuf,
                    buf.tcbuf, buf.bufpos, desel);
            }
        }
        if (clip_local) {
            sfree(term->last_selected_text);
            sfree(term->last_selected_attr);
            sfree(term->last_selected_tc);
            term->last_selected_text = buf.textbuf;
            term->last_selected_attr = buf.attrbuf;
            term->last_selected_tc = buf.tcbuf;
            term->last_selected_len = buf.bufpos;
        } else {
            sfree(buf.textbuf);
            sfree(buf.attrbuf);
            sfree(buf.tcbuf);
        }
    }
}